

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMarker.cpp
# Opt level: O2

void __thiscall chrono::ChMarker::ArchiveOUT(ChMarker *this)

{
  ChArchiveOut *in_RSI;
  
  ArchiveOUT((ChMarker *)&this[-1].abs_frame.coord_dtdt,in_RSI);
  return;
}

Assistant:

void ChMarker::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChMarker>();

    // serialize parent class
    ChObj::ArchiveOUT(marchive);
    // serialize parent class
    ChFrameMoving<double>::ArchiveOUT(marchive);

    // serialize all member data:
    eChMarkerMotion_mapper mmapper;
    marchive << CHNVP(mmapper(motion_type), "motion_type");
    marchive << CHNVP(motion_X);
    marchive << CHNVP(motion_Y);
    marchive << CHNVP(motion_Z);
    marchive << CHNVP(motion_ang);
    marchive << CHNVP(motion_axis);
}